

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.c
# Opt level: O0

_Bool test_inv(void)

{
  byte bVar1;
  uint8_t result_1;
  int i_1;
  uint8_t result;
  int i;
  _Bool success;
  uint local_10;
  uint local_8;
  _Bool local_1;
  
  local_1 = true;
  for (local_8 = 1; (int)local_8 < 0x100; local_8 = local_8 + 1) {
    gf256_inv('\0');
    bVar1 = gf256_mul('\0','\0');
    if (bVar1 != 1) {
      fprintf(_stderr,"  %d * ~%d == %d\n",(ulong)local_8,(ulong)local_8,(ulong)bVar1);
      local_1 = false;
    }
  }
  for (local_10 = 1; (int)local_10 < 0x100; local_10 = local_10 + 1) {
    gf256_inv('\0');
    bVar1 = gf256_inv('\0');
    if (bVar1 != local_10) {
      fprintf(_stderr,"  ~~%d = %d.\n",(ulong)local_10,(ulong)bVar1);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool test_inv()
{
	bool success = true;

	/* x * ~x = 1 */
	for (int i = 1; i <= 255; ++i) {
		const uint8_t result = gf256_mul(i, gf256_inv(i));
		if (result != 1) {
			fprintf(stderr, "  %d * ~%d == %d\n",
				i, i, result);
			success = false;
		}
	}

	/* ~~x = x */
	for (int i = 1; i <= 255; ++i) {
		const uint8_t result = gf256_inv(gf256_inv(i));
		if (result != i) {
			fprintf(stderr, "  ~~%d = %d.\n", i, result);
			success = false;
		}
	}

	return success;
}